

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O1

void xmlParseCDSect(xmlParserCtxtPtr ctxt)

{
  xmlParserInputPtr pxVar1;
  _xmlSAXHandler *p_Var2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  xmlChar *pxVar6;
  long lVar7;
  cdataBlockSAXFunc p_Var8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  ulong uVar14;
  int l;
  int sl;
  int rl;
  xmlChar *local_58;
  int local_44;
  int local_40;
  int local_3c;
  ulong local_38;
  
  iVar12 = 1000000000;
  if ((ctxt->options & 0x80000) == 0) {
    iVar12 = 10000000;
  }
  pxVar1 = ctxt->input;
  pxVar6 = pxVar1->cur;
  if (*pxVar6 != '<') {
    return;
  }
  if (pxVar6[1] != '!') {
    return;
  }
  if (pxVar6[2] != '[') {
    return;
  }
  pxVar1->cur = pxVar6 + 3;
  pxVar1->col = pxVar1->col + 3;
  if (pxVar6[3] == '\0') {
    xmlParserGrow(ctxt);
  }
  pxVar1 = ctxt->input;
  pxVar6 = pxVar1->cur;
  if (*pxVar6 != 'C') {
    return;
  }
  if (pxVar6[1] != 'D') {
    return;
  }
  if (pxVar6[2] != 'A') {
    return;
  }
  if (pxVar6[3] != 'T') {
    return;
  }
  if (pxVar6[4] != 'A') {
    return;
  }
  if (pxVar6[5] != '[') {
    return;
  }
  pxVar1->cur = pxVar6 + 6;
  pxVar1->col = pxVar1->col + 6;
  if (pxVar6[6] == '\0') {
    xmlParserGrow(ctxt);
  }
  uVar3 = xmlCurrentChar(ctxt,&local_3c);
  uVar14 = 0xfffd;
  if (uVar3 != 0x200000) {
    uVar14 = (ulong)uVar3;
  }
  uVar3 = (uint)uVar14;
  if ((int)uVar3 < 0x100) {
    if ((0x1f < (int)uVar3) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0)))) {
LAB_0013be3e:
      pxVar1 = ctxt->input;
      if (*pxVar1->cur == '\n') {
        pxVar1->line = pxVar1->line + 1;
        pxVar1->col = 1;
      }
      else {
        pxVar1->col = pxVar1->col + 1;
      }
      pxVar1->cur = pxVar1->cur + local_3c;
      uVar4 = xmlCurrentChar(ctxt,&local_40);
      uVar3 = 0xfffd;
      if (uVar4 != 0x200000) {
        uVar3 = uVar4;
      }
      if ((int)uVar3 < 0x100) {
        if ((0x1f < (int)uVar3) || ((uVar3 < 0xe && ((0x2600U >> (uVar3 & 0x1f) & 1) != 0)))) {
LAB_0013bea2:
          pxVar1 = ctxt->input;
          if (*pxVar1->cur == '\n') {
            pxVar1->line = pxVar1->line + 1;
            pxVar1->col = 1;
          }
          else {
            pxVar1->col = pxVar1->col + 1;
          }
          pxVar1->cur = pxVar1->cur + local_40;
          uVar4 = xmlCurrentChar(ctxt,&local_44);
          local_58 = (xmlChar *)(*xmlMalloc)(100);
          if (local_58 != (xmlChar *)0x0) {
            iVar11 = 100;
            iVar10 = 0;
            do {
              uVar13 = uVar4;
              if (uVar4 == 0x200000) {
                uVar13 = 0xfffd;
              }
              if ((int)uVar13 < 0x100) {
                if ((0x1f < (int)uVar13) ||
                   ((uVar13 < 0xe && ((0x2600U >> (uVar13 & 0x1f) & 1) != 0)))) goto LAB_0013bfc2;
LAB_0013c12f:
                local_58[iVar10] = '\0';
                if (uVar13 == 0x3e) {
                  pxVar1 = ctxt->input;
                  if (*pxVar1->cur == '\n') {
                    pxVar1->line = pxVar1->line + 1;
                    pxVar1->col = 1;
                  }
                  else {
                    pxVar1->col = pxVar1->col + 1;
                  }
                  pxVar1->cur = pxVar1->cur + local_44;
                  p_Var2 = ctxt->sax;
                  if ((p_Var2 != (_xmlSAXHandler *)0x0) && (ctxt->disableSAX == 0)) {
                    if ((ctxt->options & 0x4000) == 0) {
                      p_Var8 = p_Var2->cdataBlock;
                    }
                    else {
                      p_Var8 = p_Var2->characters;
                    }
                    if (p_Var8 != (cdataBlockSAXFunc)0x0) {
                      (*p_Var8)(ctxt->userData,local_58,iVar10);
                    }
                  }
                }
                else {
                  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_CDATA_NOT_FINISHED,
                             XML_ERR_FATAL,local_58,(xmlChar *)0x0,(xmlChar *)0x0,0,
                             "CData section not finished\n%.50s\n",local_58);
                }
                goto LAB_0013c216;
              }
              if ((0xfffff < uVar13 - 0x10000 && 0x1ffd < uVar13 - 0xe000) && 0xd7ff < (int)uVar13)
              goto LAB_0013c12f;
LAB_0013bfc2:
              if (uVar13 == 0x3e && (uVar3 == 0x5d && (int)uVar14 == 0x5d)) goto LAB_0013c12f;
              if (iVar11 <= iVar10 + 5) {
                iVar5 = 1;
                if (((0 < iVar11) && (iVar5 = -1, iVar11 < iVar12)) &&
                   (uVar4 = iVar11 + 1U >> 1, iVar5 = uVar4 + iVar11, (int)(iVar12 - uVar4) < iVar11
                   )) {
                  iVar5 = iVar12;
                }
                local_38 = uVar14;
                if (iVar5 < 0) {
                  xmlCtxtErr(ctxt,(xmlNodePtr)0x0,XML_FROM_PARSER,XML_ERR_CDATA_NOT_FINISHED,
                             XML_ERR_FATAL,(xmlChar *)0x0,(xmlChar *)0x0,(xmlChar *)0x0,0,"%s",
                             "CData section too big found\n");
LAB_0013c097:
                  iVar9 = 6;
                }
                else {
                  pxVar6 = (xmlChar *)(*xmlRealloc)(local_58,(size_t)iVar5);
                  if (pxVar6 == (xmlChar *)0x0) {
                    xmlCtxtErrMemory(ctxt);
                    goto LAB_0013c097;
                  }
                  iVar9 = 0;
                  iVar11 = iVar5;
                  local_58 = pxVar6;
                }
                uVar14 = local_38;
                if (iVar9 != 0) goto LAB_0013c16d;
              }
              if ((int)uVar14 < 0x80) {
                lVar7 = (long)iVar10;
                iVar10 = iVar10 + 1;
                local_58[lVar7] = (xmlChar)uVar14;
              }
              else {
                iVar5 = xmlCopyCharMultiByte(local_58 + iVar10,(int)uVar14);
                iVar10 = iVar5 + iVar10;
              }
              local_3c = local_40;
              local_40 = local_44;
              pxVar1 = ctxt->input;
              if (*pxVar1->cur == '\n') {
                pxVar1->line = pxVar1->line + 1;
                pxVar1->col = 1;
              }
              else {
                pxVar1->col = pxVar1->col + 1;
              }
              pxVar1->cur = pxVar1->cur + local_44;
              uVar4 = xmlCurrentChar(ctxt,&local_44);
              uVar14 = (ulong)uVar3;
              uVar3 = uVar13;
            } while( true );
          }
          xmlCtxtErrMemory(ctxt);
          local_58 = (xmlChar *)0x0;
          goto LAB_0013c216;
        }
      }
      else if ((uVar3 - 0x10000 < 0x100000 || uVar3 - 0xe000 < 0x1ffe) || (int)uVar3 < 0xd800)
      goto LAB_0013bea2;
    }
  }
  else if ((uVar3 - 0x10000 < 0x100000 || uVar3 - 0xe000 < 0x1ffe) || (int)uVar3 < 0xd800)
  goto LAB_0013be3e;
  local_58 = (xmlChar *)0x0;
  xmlFatalErr(ctxt,XML_ERR_CDATA_NOT_FINISHED,(char *)0x0);
LAB_0013c216:
  (*xmlFree)(local_58);
  return;
LAB_0013c16d:
  if (iVar9 != 6) {
    return;
  }
  goto LAB_0013c216;
}

Assistant:

void
xmlParseCDSect(xmlParserCtxtPtr ctxt) {
    xmlChar *buf = NULL;
    int len = 0;
    int size = XML_PARSER_BUFFER_SIZE;
    int r, rl;
    int	s, sl;
    int cur, l;
    int maxLength = (ctxt->options & XML_PARSE_HUGE) ?
                    XML_MAX_HUGE_LENGTH :
                    XML_MAX_TEXT_LENGTH;

    if ((CUR != '<') || (NXT(1) != '!') || (NXT(2) != '['))
        return;
    SKIP(3);

    if (!CMP6(CUR_PTR, 'C', 'D', 'A', 'T', 'A', '['))
        return;
    SKIP(6);

    r = xmlCurrentCharRecover(ctxt, &rl);
    if (!IS_CHAR(r)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
        goto out;
    }
    NEXTL(rl);
    s = xmlCurrentCharRecover(ctxt, &sl);
    if (!IS_CHAR(s)) {
	xmlFatalErr(ctxt, XML_ERR_CDATA_NOT_FINISHED, NULL);
        goto out;
    }
    NEXTL(sl);
    cur = xmlCurrentCharRecover(ctxt, &l);
    buf = xmlMalloc(size);
    if (buf == NULL) {
	xmlErrMemory(ctxt);
        goto out;
    }
    while (IS_CHAR(cur) &&
           ((r != ']') || (s != ']') || (cur != '>'))) {
	if (len + 5 >= size) {
	    xmlChar *tmp;
            int newSize;

            newSize = xmlGrowCapacity(size, 1, 1, maxLength);
            if (newSize < 0) {
                xmlFatalErrMsg(ctxt, XML_ERR_CDATA_NOT_FINISHED,
                               "CData section too big found\n");
                goto out;
            }
	    tmp = xmlRealloc(buf, newSize);
	    if (tmp == NULL) {
		xmlErrMemory(ctxt);
                goto out;
	    }
	    buf = tmp;
	    size = newSize;
	}
	COPY_BUF(buf, len, r);
	r = s;
	rl = sl;
	s = cur;
	sl = l;
	NEXTL(l);
	cur = xmlCurrentCharRecover(ctxt, &l);
    }
    buf[len] = 0;
    if (cur != '>') {
	xmlFatalErrMsgStr(ctxt, XML_ERR_CDATA_NOT_FINISHED,
	                     "CData section not finished\n%.50s\n", buf);
        goto out;
    }
    NEXTL(l);

    /*
     * OK the buffer is to be consumed as cdata.
     */
    if ((ctxt->sax != NULL) && (!ctxt->disableSAX)) {
        if (ctxt->options & XML_PARSE_NOCDATA) {
            if (ctxt->sax->characters != NULL)
                ctxt->sax->characters(ctxt->userData, buf, len);
        } else {
            if (ctxt->sax->cdataBlock != NULL)
                ctxt->sax->cdataBlock(ctxt->userData, buf, len);
        }
    }

out:
    xmlFree(buf);
}